

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O3

void Executor::declareSequence(treeNode *node,string *flag)

{
  treeNode *ptVar1;
  pointer pcVar2;
  treeNode *ptVar3;
  int iVar4;
  AttrKind AVar5;
  Var *pVVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  _Alloc_hider _Var7;
  _Alloc_hider local_90;
  char local_80 [4];
  undefined4 in_stack_ffffffffffffff84;
  string local_70;
  string local_50;
  
  if ((node->kind).stmtKind == doRpt) {
    pVVar6 = (Var *)operator_new(0x38);
    (pVVar6->text)._M_dataplus._M_p = (pointer)0x0;
    (pVVar6->text)._M_string_length = 0;
    (pVVar6->text).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pVVar6->text).field_2 + 8) = 0;
    *(undefined8 *)pVVar6 = 0;
    pVVar6->array = (void *)0x0;
    *(undefined8 *)&pVVar6->kind = 0;
    (pVVar6->text)._M_dataplus._M_p = (pointer)&(pVVar6->text).field_2;
    (pVVar6->text).field_2._M_local_buf[0] = '\0';
    iVar4 = std::__cxx11::string::compare((char *)flag);
    if (iVar4 == 0) {
      (pVVar6->value).integer = 0;
      AVar5 = Integer;
LAB_0010a725:
      pVVar6->kind = AVar5;
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)flag);
      if (iVar4 == 0) {
        (pVVar6->value).integer = 0;
        AVar5 = Decmical;
        goto LAB_0010a725;
      }
      iVar4 = std::__cxx11::string::compare((char *)flag);
      if (iVar4 == 0) {
        (pVVar6->value).boolean = false;
        AVar5 = Boolean;
        goto LAB_0010a725;
      }
      iVar4 = std::__cxx11::string::compare((char *)flag);
      if (iVar4 == 0) {
        std::__cxx11::string::_M_replace
                  ((ulong)&pVVar6->text,0,(char *)(pVVar6->text)._M_string_length,0x10c37a);
        AVar5 = Text;
        goto LAB_0010a725;
      }
    }
    pcVar2 = (node->text)._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + (node->text)._M_string_length);
    setVar(&local_50,pVVar6);
    _Var7._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_0010a817;
  }
  else {
    ptVar3 = node->child[0];
    if (ptVar3->child[0] != (treeNode *)0x0) goto LAB_0010a817;
    ptVar1 = node->child[1];
    pVVar6 = (Var *)operator_new(0x38);
    (pVVar6->text)._M_dataplus._M_p = (pointer)0x0;
    (pVVar6->text)._M_string_length = 0;
    (pVVar6->text).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pVVar6->text).field_2 + 8) = 0;
    *(undefined8 *)pVVar6 = 0;
    pVVar6->array = (void *)0x0;
    *(undefined8 *)&pVVar6->kind = 0;
    (pVVar6->text)._M_dataplus._M_p = (pointer)&(pVVar6->text).field_2;
    (pVVar6->text).field_2._M_local_buf[0] = '\0';
    if (ptVar1->sibling != (treeNode *)0x0) {
LAB_0010a869:
      reportError(in_stack_ffffffffffffff84);
    }
    exp(0.0);
    iVar4 = std::__cxx11::string::compare((char *)flag);
    if (iVar4 == 0) {
      if (*(int *)(extraout_RAX->_M_local_buf + 0x50) != 0) goto LAB_0010a869;
      pVVar6->value = *(Value *)(extraout_RAX->_M_local_buf + 0x54);
      AVar5 = Integer;
LAB_0010a7b5:
      pVVar6->kind = AVar5;
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)flag);
      if (iVar4 == 0) {
        if (*(int *)(extraout_RAX->_M_local_buf + 0x50) != 1) goto LAB_0010a869;
        pVVar6->value = *(Value *)(extraout_RAX->_M_local_buf + 0x54);
        AVar5 = Decmical;
        goto LAB_0010a7b5;
      }
      iVar4 = std::__cxx11::string::compare((char *)flag);
      if (iVar4 == 0) {
        if (*(int *)(extraout_RAX->_M_local_buf + 0x50) != 2) goto LAB_0010a869;
        (pVVar6->value).boolean = (bool)extraout_RAX->_M_local_buf[0x54];
        AVar5 = Boolean;
        goto LAB_0010a7b5;
      }
      iVar4 = std::__cxx11::string::compare((char *)flag);
      if (iVar4 == 0) {
        if (*(int *)(extraout_RAX->_M_local_buf + 0x50) != 3) goto LAB_0010a869;
        std::__cxx11::string::_M_assign((string *)&pVVar6->text);
        AVar5 = Text;
        goto LAB_0010a7b5;
      }
    }
    pcVar2 = (ptVar3->text)._M_dataplus._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + (ptVar3->text)._M_string_length);
    setVar(&local_70,pVVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    _Var7._M_p = (pointer)extraout_RAX;
    if ((extraout_RAX !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0) &&
       (*(char **)(extraout_RAX->_M_local_buf + 0x30) != extraout_RAX->_M_local_buf + 0x40)) {
      operator_delete(*(char **)(extraout_RAX->_M_local_buf + 0x30));
    }
  }
  operator_delete(_Var7._M_p);
LAB_0010a817:
  ptVar3 = node->sibling;
  if (ptVar3 != (treeNode *)0x0) {
    pcVar2 = (flag->_M_dataplus)._M_p;
    local_90._M_p = local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar2,pcVar2 + flag->_M_string_length);
    declareSequence(ptVar3,(string *)&local_90);
    if (local_90._M_p != local_80) {
      operator_delete(local_90._M_p);
    }
  }
  return;
}

Assistant:

void declareSequence(treeNode* node,string flag)
    {
        auto id = node->child[0];
        auto val = node->child[1];
        if(node->kind.expKind==ExpKind::idExp)
        {
            auto defalutVal = new Var();
            if(flag=="int")         {defalutVal->value.integer=0;defalutVal->kind=AttrKind::Integer;}
            else if(flag=="float")  {defalutVal->value.decmical=0;defalutVal->kind=AttrKind::Decmical;}
            else if(flag=="bool")   {defalutVal->value.boolean=false;defalutVal->kind=AttrKind::Boolean;}
            else if(flag=="string") {defalutVal->text="";defalutVal->kind=AttrKind::Text;}
            setVar(node->text,defalutVal);
        }
        else if(id->child[0]!=nullptr)//是数组！麻烦死了
        {
            // auto p1 = id->child[0];
            // auto p2 = val;
            
        }
        else
        {
            auto var = new Var();
            if(val->sibling!=nullptr)reportError(Error::errorType);
            val = exp(val);
            if(flag=="int")
            {
                if(val->attrKind!=AttrKind::Integer)reportError(Error::errorType);
                var->value.integer=val->attr.integer;
                var->kind=AttrKind::Integer;
            }
            else if(flag=="float")
            {
                if(val->attrKind!=AttrKind::Decmical)reportError(Error::errorType);
                var->value.decmical=val->attr.decmical;
                var->kind=AttrKind::Decmical;
            }
            else if(flag=="bool")
            {
                if(val->attrKind!=AttrKind::Boolean)reportError(Error::errorType);
                var->value.boolean=val->attr.boolean;
                var->kind=AttrKind::Boolean;
            }
            else if(flag=="string")
            {
                if(val->attrKind!=AttrKind::Text)reportError(Error::errorType);
                var->text=val->text;
                var->kind=AttrKind::Text;
            }
            setVar(id->text,var);
            delete val;
        }
        if(node->sibling!=nullptr)declareSequence(node->sibling,flag);
    }